

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmtime_s.c
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    time_t t;
    struct tm time;

    /* TODO: Constraint handling */

    t = -2147483648l;
    TESTCASE( gmtime_s( &t, &time ) != NULL );
    TESTCASE( time.tm_sec == 52 );
    TESTCASE( time.tm_min == 45 );
    TESTCASE( time.tm_hour == 20 );
    TESTCASE( time.tm_mday == 13 );
    TESTCASE( time.tm_mon == 11 );
    TESTCASE( time.tm_year == 1 );
    TESTCASE( time.tm_wday == 5 );
    TESTCASE( time.tm_yday == 346 );

    t = 2147483647l;
    TESTCASE( gmtime_s( &t, &time ) != NULL );
    TESTCASE( time.tm_sec == 7 );
    TESTCASE( time.tm_min == 14 );
    TESTCASE( time.tm_hour == 3 );
    TESTCASE( time.tm_mday == 19 );
    TESTCASE( time.tm_mon == 0 );
    TESTCASE( time.tm_year == 138 );
    TESTCASE( time.tm_wday == 2 );
    TESTCASE( time.tm_yday == 18 );
#endif

    return TEST_RESULTS;
}